

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O0

void __thiscall cmCPackIFWInstaller::ConfigureFromOptions(cmCPackIFWInstaller *this)

{
  bool bVar1;
  char *pcVar2;
  reference s;
  ulong uVar3;
  allocator local_689;
  string local_688;
  char *local_668;
  char *optIFW_CONTROL_SCRIPT;
  string local_658;
  allocator local_631;
  string local_630;
  allocator local_609;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  allocator local_5b9;
  string local_5b8;
  char *local_598;
  char *optIFW_MAINTENANCE_TOOL_INI;
  string local_588;
  char *local_568;
  char *optIFW_MAINTENANCE_TOOL;
  char *local_540;
  char *displayName;
  char *local_518;
  char *password;
  char *local_4f0;
  char *username;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  char *local_4a8;
  char *url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  undefined1 local_460 [8];
  string prefix;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_438;
  iterator rit;
  string local_428;
  undefined1 local_408 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RepoAllVector;
  string local_3e8;
  char *local_3c8;
  char *RepoAllStr;
  string local_3b8;
  char *local_398;
  char *site;
  RepositoryStruct Repo;
  string local_2e8;
  char *local_2c8;
  char *option_5;
  string local_2b8;
  char *local_298;
  char *optPACKAGE_INSTALL_DIRECTORY;
  string local_288;
  char *local_268;
  char *optIFW_TARGET_DIRECTORY;
  string local_258;
  char *local_238;
  char *optIFW_START_MENU_DIR;
  string local_228;
  char *local_208;
  char *option_4;
  string local_1f8;
  char *local_1d8;
  char *option_3;
  string local_1c8;
  char *local_1a8;
  char *option_2;
  string local_198;
  char *local_178;
  char *option_1;
  string local_168;
  char *local_148;
  char *optPACKAGE_VENDOR;
  string local_138;
  char *local_118;
  char *optIFW_PACKAGE_PUBLISHER;
  string local_108;
  char *local_e8;
  char *option;
  string local_d8;
  char *local_b8;
  char *optPACKAGE_DESCRIPTION_SUMMARY;
  string local_a8;
  char *local_88;
  char *optIFW_PACKAGE_TITLE;
  string local_78;
  char *local_58;
  char *optPACKAGE_NAME;
  allocator local_39;
  string local_38;
  char *local_18;
  char *optIFW_PACKAGE_NAME;
  cmCPackIFWInstaller *this_local;
  
  optIFW_PACKAGE_NAME = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CPACK_IFW_PACKAGE_NAME",&local_39);
  pcVar2 = GetOption(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"CPACK_PACKAGE_NAME",
               (allocator *)((long)&optIFW_PACKAGE_TITLE + 7));
    pcVar2 = GetOption(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_PACKAGE_TITLE + 7));
    local_58 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)this,"Your package");
    }
    else {
      std::__cxx11::string::operator=((string *)this,pcVar2);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)this,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"CPACK_IFW_PACKAGE_TITLE",
             (allocator *)((long)&optPACKAGE_DESCRIPTION_SUMMARY + 7));
  pcVar2 = GetOption(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optPACKAGE_DESCRIPTION_SUMMARY + 7));
  local_88 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d8,"CPACK_PACKAGE_DESCRIPTION_SUMMARY",
               (allocator *)((long)&option + 7));
    pcVar2 = GetOption(this,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&option + 7));
    local_b8 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Title,"Your package description");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Title,pcVar2);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Title,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"CPACK_PACKAGE_VERSION",
             (allocator *)((long)&optIFW_PACKAGE_PUBLISHER + 7));
  pcVar2 = GetOption(this,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_PACKAGE_PUBLISHER + 7));
  local_e8 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->Version,"1.0.0");
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Version,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"CPACK_IFW_PACKAGE_PUBLISHER",
             (allocator *)((long)&optPACKAGE_VENDOR + 7));
  pcVar2 = GetOption(this,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optPACKAGE_VENDOR + 7));
  local_118 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_168,"CPACK_PACKAGE_VENDOR",(allocator *)((long)&option_1 + 7));
    pcVar2 = GetOption(this,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)((long)&option_1 + 7));
    local_148 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Publisher,pcVar2);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->Publisher,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_198,"CPACK_IFW_PRODUCT_URL",(allocator *)((long)&option_2 + 7));
  pcVar2 = GetOption(this,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&option_2 + 7));
  local_178 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ProductUrl,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,"CPACK_IFW_PACKAGE_ICON",(allocator *)((long)&option_3 + 7));
  pcVar2 = GetOption(this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&option_3 + 7));
  local_1a8 = pcVar2;
  if ((pcVar2 != (char *)0x0) && (bVar1 = cmsys::SystemTools::FileExists(pcVar2), bVar1)) {
    std::__cxx11::string::operator=((string *)&this->InstallerApplicationIcon,local_1a8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f8,"CPACK_IFW_PACKAGE_WINDOW_ICON",(allocator *)((long)&option_4 + 7)
            );
  pcVar2 = GetOption(this,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&option_4 + 7));
  local_1d8 = pcVar2;
  if ((pcVar2 != (char *)0x0) && (bVar1 = cmsys::SystemTools::FileExists(pcVar2), bVar1)) {
    std::__cxx11::string::operator=((string *)&this->InstallerWindowIcon,local_1d8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"CPACK_IFW_PACKAGE_LOGO",
             (allocator *)((long)&optIFW_START_MENU_DIR + 7));
  pcVar2 = GetOption(this,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_START_MENU_DIR + 7));
  local_208 = pcVar2;
  if ((pcVar2 != (char *)0x0) && (bVar1 = cmsys::SystemTools::FileExists(pcVar2), bVar1)) {
    std::__cxx11::string::operator=((string *)&this->Logo,local_208);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_258,"CPACK_IFW_PACKAGE_START_MENU_DIRECTORY",
             (allocator *)((long)&optIFW_TARGET_DIRECTORY + 7));
  pcVar2 = GetOption(this,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_TARGET_DIRECTORY + 7));
  local_238 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->StartMenuDir,(string *)this);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->StartMenuDir,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_288,"CPACK_IFW_TARGET_DIRECTORY",
             (allocator *)((long)&optPACKAGE_INSTALL_DIRECTORY + 7));
  pcVar2 = GetOption(this,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optPACKAGE_INSTALL_DIRECTORY + 7));
  local_268 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2b8,"CPACK_PACKAGE_INSTALL_DIRECTORY",
               (allocator *)((long)&option_5 + 7));
    pcVar2 = GetOption(this,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&option_5 + 7));
    local_298 = pcVar2;
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->TargetDir,"@RootDir@/usr/local");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->TargetDir,"@ApplicationsDir@/");
      std::__cxx11::string::operator+=((string *)&this->TargetDir,local_298);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&this->TargetDir,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2e8,"CPACK_IFW_ADMIN_TARGET_DIRECTORY",
             (allocator *)(Repo.DisplayName.field_2._M_local_buf + 0xf));
  pcVar2 = GetOption(this,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)(Repo.DisplayName.field_2._M_local_buf + 0xf))
  ;
  local_2c8 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->AdminTargetDir,pcVar2);
  }
  std::
  vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
  ::clear(&this->Repositories);
  RepositoryStruct::RepositoryStruct((RepositoryStruct *)&site);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3b8,"CPACK_DOWNLOAD_SITE",(allocator *)((long)&RepoAllStr + 7));
  pcVar2 = GetOption(this,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&RepoAllStr + 7));
  local_398 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&site,pcVar2);
    std::
    vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
    ::push_back(&this->Repositories,(value_type *)&site);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3e8,"CPACK_IFW_REPOSITORIES_ALL",
             (allocator *)
             ((long)&RepoAllVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar2 = GetOption(this,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&RepoAllVector.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_3c8 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_408);
    pcVar2 = local_3c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_428,pcVar2,(allocator *)((long)&rit._M_current + 7));
    cmSystemTools::ExpandListArgument
              (&local_428,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_408,false);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rit._M_current + 7));
    local_438._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_408);
    while( true ) {
      prefix.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_408);
      bVar1 = __gnu_cxx::operator!=
                        (&local_438,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&prefix.field_2 + 8));
      if (!bVar1) break;
      s = __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_438);
      cmsys::SystemTools::UpperCase((string *)&url,s);
      std::operator+(&local_480,"CPACK_IFW_REPOSITORY_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&url);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     &local_480,"_");
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::~string((string *)&url);
      std::operator+(&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     "URL");
      pcVar2 = GetOption(this,&local_4c8);
      std::__cxx11::string::~string((string *)&local_4c8);
      local_4a8 = pcVar2;
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&site,"");
      }
      else {
        std::__cxx11::string::operator=((string *)&site,pcVar2);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&username,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     "DISABLED");
      bVar1 = IsOn(this,(string *)&username);
      std::__cxx11::string::~string((string *)&username);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(Repo.Url.field_2._M_local_buf + 8),"0");
      }
      else {
        std::__cxx11::string::operator=((string *)(Repo.Url.field_2._M_local_buf + 8),"");
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&password,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     "USERNAME");
      pcVar2 = GetOption(this,(string *)&password);
      std::__cxx11::string::~string((string *)&password);
      local_4f0 = pcVar2;
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)(Repo.Enabled.field_2._M_local_buf + 8),"");
      }
      else {
        std::__cxx11::string::operator=((string *)(Repo.Enabled.field_2._M_local_buf + 8),pcVar2);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &displayName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     "PASSWORD");
      pcVar2 = GetOption(this,(string *)&displayName);
      std::__cxx11::string::~string((string *)&displayName);
      local_518 = pcVar2;
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)(Repo.Username.field_2._M_local_buf + 8),"");
      }
      else {
        std::__cxx11::string::operator=((string *)(Repo.Username.field_2._M_local_buf + 8),pcVar2);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &optIFW_MAINTENANCE_TOOL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     "DISPLAY_NAME");
      pcVar2 = GetOption(this,(string *)&optIFW_MAINTENANCE_TOOL);
      std::__cxx11::string::~string((string *)&optIFW_MAINTENANCE_TOOL);
      local_540 = pcVar2;
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)(Repo.Password.field_2._M_local_buf + 8),"");
      }
      else {
        std::__cxx11::string::operator=((string *)(Repo.Password.field_2._M_local_buf + 8),pcVar2);
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::
        vector<cmCPackIFWInstaller::RepositoryStruct,_std::allocator<cmCPackIFWInstaller::RepositoryStruct>_>
        ::push_back(&this->Repositories,(value_type *)&site);
      }
      std::__cxx11::string::~string((string *)local_460);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_438);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_408);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_588,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME",
             (allocator *)((long)&optIFW_MAINTENANCE_TOOL_INI + 7));
  pcVar2 = GetOption(this,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_MAINTENANCE_TOOL_INI + 7));
  local_568 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->MaintenanceToolName,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5b8,"CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE",&local_5b9);
  pcVar2 = GetOption(this,&local_5b8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  local_598 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->MaintenanceToolIniFile,pcVar2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5e0,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS",&local_5e1);
  pcVar2 = GetOption(this,&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  if (pcVar2 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_608,"CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS",&local_609);
    bVar1 = IsOn(this,&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator((allocator<char> *)&local_609);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->AllowNonAsciiCharacters,"true");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->AllowNonAsciiCharacters,"false");
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_630,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH",&local_631);
  pcVar2 = GetOption(this,&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  if (pcVar2 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_658,"CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH",
               (allocator *)((long)&optIFW_CONTROL_SCRIPT + 7));
    bVar1 = IsOn(this,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_CONTROL_SCRIPT + 7));
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->AllowSpaceInPath,"true");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->AllowSpaceInPath,"false");
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_688,"CPACK_IFW_PACKAGE_CONTROL_SCRIPT",&local_689);
  pcVar2 = GetOption(this,&local_688);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  local_668 = pcVar2;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ControlScript,pcVar2);
  }
  RepositoryStruct::~RepositoryStruct((RepositoryStruct *)&site);
  return;
}

Assistant:

void cmCPackIFWInstaller::ConfigureFromOptions()
{
  // Name;
  if (const char* optIFW_PACKAGE_NAME =
      this->GetOption("CPACK_IFW_PACKAGE_NAME"))
    {
    Name = optIFW_PACKAGE_NAME;
    }
  else if (const char* optPACKAGE_NAME =
           this->GetOption("CPACK_PACKAGE_NAME"))
    {
    Name = optPACKAGE_NAME;
    }
  else
    {
    Name = "Your package";
    }

  // Title;
  if (const char* optIFW_PACKAGE_TITLE =
      GetOption("CPACK_IFW_PACKAGE_TITLE"))
    {
    Title = optIFW_PACKAGE_TITLE;
    }
  else if (const char* optPACKAGE_DESCRIPTION_SUMMARY =
           GetOption("CPACK_PACKAGE_DESCRIPTION_SUMMARY"))
    {
    Title = optPACKAGE_DESCRIPTION_SUMMARY;
    }
  else
    {
    Title = "Your package description";
    }

  // Version;
  if (const char* option = GetOption("CPACK_PACKAGE_VERSION"))
    {
    Version = option;
    }
  else
    {
    Version = "1.0.0";
    }

  // Publisher
  if(const char* optIFW_PACKAGE_PUBLISHER =
     GetOption("CPACK_IFW_PACKAGE_PUBLISHER"))
    {
    Publisher = optIFW_PACKAGE_PUBLISHER;
    }
  else if(const char* optPACKAGE_VENDOR = GetOption("CPACK_PACKAGE_VENDOR"))
    {
    Publisher = optPACKAGE_VENDOR;
    }

  // ProductUrl
  if(const char* option = GetOption("CPACK_IFW_PRODUCT_URL"))
    {
    ProductUrl = option;
    }

  // ApplicationIcon
  if(const char* option = GetOption("CPACK_IFW_PACKAGE_ICON"))
    {
    if(cmSystemTools::FileExists(option))
      {
      InstallerApplicationIcon = option;
      }
    else
      {
      // TODO: implement warning
      }
    }

  // WindowIcon
  if(const char* option = GetOption("CPACK_IFW_PACKAGE_WINDOW_ICON"))
    {
    if(cmSystemTools::FileExists(option))
      {
      InstallerWindowIcon = option;
      }
    else
      {
      // TODO: implement warning
      }
    }

  // Logo
  if(const char* option = GetOption("CPACK_IFW_PACKAGE_LOGO"))
    {
    if(cmSystemTools::FileExists(option))
      {
      Logo = option;
      }
    else
      {
      // TODO: implement warning
      }
    }

  // Start menu
  if (const char* optIFW_START_MENU_DIR =
      this->GetOption("CPACK_IFW_PACKAGE_START_MENU_DIRECTORY"))
    {
    StartMenuDir = optIFW_START_MENU_DIR;
    }
  else
    {
    StartMenuDir = Name;
    }

  // Default target directory for installation
  if (const char* optIFW_TARGET_DIRECTORY =
      GetOption("CPACK_IFW_TARGET_DIRECTORY"))
    {
    TargetDir = optIFW_TARGET_DIRECTORY;
    }
  else if (const char *optPACKAGE_INSTALL_DIRECTORY =
           GetOption("CPACK_PACKAGE_INSTALL_DIRECTORY"))
    {
    TargetDir = "@ApplicationsDir@/";
    TargetDir += optPACKAGE_INSTALL_DIRECTORY;
    }
  else
    {
    TargetDir = "@RootDir@/usr/local";
    }

  // Default target directory for installation with administrator rights
  if (const char* option = GetOption("CPACK_IFW_ADMIN_TARGET_DIRECTORY"))
    {
    AdminTargetDir = option;
    }

  // Repositories
  Repositories.clear();
  RepositoryStruct Repo;
  if(const char *site = this->GetOption("CPACK_DOWNLOAD_SITE"))
    {
    Repo.Url = site;
    Repositories.push_back(Repo);
    }
  if(const char *RepoAllStr = this->GetOption("CPACK_IFW_REPOSITORIES_ALL"))
    {
    std::vector<std::string> RepoAllVector;
    cmSystemTools::ExpandListArgument(RepoAllStr,
                                      RepoAllVector);
    for(std::vector<std::string>::iterator
          rit = RepoAllVector.begin(); rit != RepoAllVector.end(); ++rit)
      {
        std::string prefix = "CPACK_IFW_REPOSITORY_"
          + cmsys::SystemTools::UpperCase(*rit)
          + "_";
        // Url
        if (const char* url = GetOption(prefix + "URL"))
          {
          Repo.Url = url;
          }
        else
          {
          Repo.Url = "";
          }
        // Enabled
        if (IsOn(prefix + "DISABLED"))
          {
          Repo.Enabled = "0";
          }
        else
          {
          Repo.Enabled = "";
          }
        // Username
        if (const char* username = GetOption(prefix + "USERNAME"))
          {
          Repo.Username = username;
          }
        else
          {
          Repo.Username = "";
          }
        // Password
        if (const char* password = GetOption(prefix + "PASSWORD"))
          {
          Repo.Password = password;
          }
        else
          {
          Repo.Password = "";
          }
        // DisplayName
        if (const char* displayName = GetOption(prefix + "DISPLAY_NAME"))
          {
          Repo.DisplayName = displayName;
          }
        else
          {
          Repo.DisplayName = "";
          }

        if(!Repo.Url.empty())
          {
          Repositories.push_back(Repo);
          }
      }
    }

  // Maintenance tool
  if(const char* optIFW_MAINTENANCE_TOOL =
      this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_NAME"))
    {
    MaintenanceToolName = optIFW_MAINTENANCE_TOOL;
    }

  // Maintenance tool ini file
  if(const char* optIFW_MAINTENANCE_TOOL_INI =
      this->GetOption("CPACK_IFW_PACKAGE_MAINTENANCE_TOOL_INI_FILE"))
    {
    MaintenanceToolIniFile = optIFW_MAINTENANCE_TOOL_INI;
    }

  // Allow non-ASCII characters
  if(this->GetOption("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS"))
    {
    if(IsOn("CPACK_IFW_PACKAGE_ALLOW_NON_ASCII_CHARACTERS"))
      {
      AllowNonAsciiCharacters = "true";
      }
    else
      {
      AllowNonAsciiCharacters = "false";
      }
    }

  // Space in path
  if(this->GetOption("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH"))
    {
    if(IsOn("CPACK_IFW_PACKAGE_ALLOW_SPACE_IN_PATH"))
      {
      AllowSpaceInPath = "true";
      }
    else
      {
      AllowSpaceInPath = "false";
      }
    }

  // Control script
  if(const char* optIFW_CONTROL_SCRIPT =
      this->GetOption("CPACK_IFW_PACKAGE_CONTROL_SCRIPT"))
    {
    ControlScript = optIFW_CONTROL_SCRIPT;
    }
}